

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string&>
          (Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer __s1;
  size_t __n;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  undefined8 in_RCX;
  uint uVar11;
  size_t *psVar12;
  long lVar13;
  ulong uVar14;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar15;
  undefined8 local_50;
  ulong local_40;
  
  iVar8 = 0;
  local_50 = in_RCX;
  do {
    sVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    uVar14 = sVar9 * *(long *)this >> 0x21 ^ sVar9 * *(long *)this;
    iVar4 = *(int *)(this + 0x30);
    uVar11 = ((uint)uVar14 & 0x1f) >> ((ulong)(byte)this[0x34] & 0x3f);
    sVar9 = uVar14 >> 5 & *(ulong *)(this + 0x20);
    lVar13 = *(long *)(this + 0x10);
    bVar3 = *(byte *)(lVar13 + sVar9);
    while (uVar11 = uVar11 + iVar4, uVar11 < bVar3) {
      pbVar2 = (byte *)(lVar13 + 1 + sVar9);
      sVar9 = sVar9 + 1;
      bVar3 = *pbVar2;
    }
    if (uVar11 == *(byte *)(lVar13 + sVar9)) {
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      psVar12 = (size_t *)(*(long *)(this + 8) + 8 + sVar9 * 0x28);
      do {
        if (__n == *psVar12) {
          if (__n != 0) {
            iVar7 = bcmp(__s1,(void *)psVar12[-1],__n);
            if (iVar7 != 0) goto LAB_0012c724;
          }
          bVar5 = false;
          local_50 = 1;
          goto LAB_0012c7ad;
        }
LAB_0012c724:
        uVar11 = uVar11 + iVar4;
        pbVar2 = (byte *)(lVar13 + 1 + sVar9);
        sVar9 = sVar9 + 1;
        psVar12 = psVar12 + 5;
      } while (uVar11 == *pbVar2);
    }
    if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x28)) {
      if (0xff < iVar4 + uVar11) {
        *(undefined8 *)(this + 0x28) = 0;
      }
      lVar10 = 1;
      do {
        lVar10 = lVar10 + -1;
        pcVar1 = (char *)(lVar13 + sVar9);
        lVar13 = lVar13 + 1;
      } while (*pcVar1 != '\0');
      if (lVar10 == 0) {
        local_50 = 2;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,sVar9 - lVar10,sVar9);
        local_50 = 3;
      }
      *(char *)(*(long *)(this + 0x10) + sVar9) = (char)uVar11;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      bVar5 = false;
    }
    else {
      bVar6 = Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this);
      bVar5 = true;
      sVar9 = local_40;
      if (!bVar6) {
        bVar5 = false;
        sVar9 = 0;
        local_50 = 0;
      }
    }
LAB_0012c7ad:
    if (!bVar5) goto LAB_0012c801;
    iVar8 = iVar8 + 1;
    local_40 = sVar9;
  } while (iVar8 != 0x100);
  local_50 = 0;
  sVar9 = 0;
LAB_0012c801:
  pVar15._8_8_ = local_50;
  pVar15.first = sVar9;
  return pVar15;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }